

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_andi_i64_mips(TCGContext_conflict3 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,int64_t arg2)

{
  TCGv_i64 arg2_00;
  TCGv_i64 t0;
  int64_t arg2_local;
  TCGv_i64 arg1_local;
  TCGv_i64 ret_local;
  TCGContext_conflict3 *tcg_ctx_local;
  
  if (arg2 == -1) {
    tcg_gen_mov_i64_mips(tcg_ctx,ret,arg1);
  }
  else if (arg2 == 0) {
    tcg_gen_movi_i64_mips(tcg_ctx,ret,0);
  }
  else if (arg2 == 0xff) {
    tcg_gen_op2_i64(tcg_ctx,INDEX_op_ext8u_i64,ret,arg1);
  }
  else if (arg2 == 0xffff) {
    tcg_gen_op2_i64(tcg_ctx,INDEX_op_ext16u_i64,ret,arg1);
  }
  else if (arg2 == 0xffffffff) {
    tcg_gen_op2_i64(tcg_ctx,INDEX_op_ext32u_i64,ret,arg1);
  }
  else {
    arg2_00 = tcg_const_i64_mips(tcg_ctx,arg2);
    tcg_gen_and_i64_mips(tcg_ctx,ret,arg1,arg2_00);
    tcg_temp_free_i64(tcg_ctx,arg2_00);
  }
  return;
}

Assistant:

void tcg_gen_andi_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, int64_t arg2)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_andi_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg1), arg2);
        tcg_gen_andi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg1), arg2 >> 32);
        return;
#else
    TCGv_i64 t0;

    /* Some cases can be optimized here.  */
    switch (arg2) {
    case 0:
        tcg_gen_movi_i64(tcg_ctx, ret, 0);
        return;
    case -1:
        tcg_gen_mov_i64(tcg_ctx, ret, arg1);
        return;
    case 0xff:
        /* Don't recurse with tcg_gen_ext8u_i64.  */
        if (TCG_TARGET_HAS_ext8u_i64) {
            tcg_gen_op2_i64(tcg_ctx, INDEX_op_ext8u_i64, ret, arg1);
            return;
        }
        break;
    case 0xffff:
        if (TCG_TARGET_HAS_ext16u_i64) {
            tcg_gen_op2_i64(tcg_ctx, INDEX_op_ext16u_i64, ret, arg1);
            return;
        }
        break;
    case 0xffffffffu:
        if (TCG_TARGET_HAS_ext32u_i64) {
            tcg_gen_op2_i64(tcg_ctx, INDEX_op_ext32u_i64, ret, arg1);
            return;
        }
        break;
    }
    t0 = tcg_const_i64(tcg_ctx, arg2);
    tcg_gen_and_i64(tcg_ctx, ret, arg1, t0);
    tcg_temp_free_i64(tcg_ctx, t0);
#endif
}